

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O2

void __thiscall
QOpenGLTexture::generateMipMaps(QOpenGLTexture *this,int baseLevel,bool resetBaseLevel)

{
  QOpenGLTexturePrivate *pQVar1;
  bool bVar2;
  char cVar3;
  long lVar4;
  int baseLevel_00;
  
  pQVar1 = (this->d_ptr).d;
  bVar2 = isCompressedFormat(pQVar1->format);
  if (((bVar2) && (lVar4 = QOpenGLContext::currentContext(), lVar4 != 0)) &&
     (cVar3 = QOpenGLContext::isOpenGLES(), cVar3 != '\0')) {
    return;
  }
  baseLevel_00 = -0x55555556;
  if (resetBaseLevel) {
    baseLevel_00 = ((this->d_ptr).d)->baseLevel;
  }
  setMipBaseLevel(this,baseLevel);
  QOpenGLTextureHelper::glGenerateTextureMipmap
            (pQVar1->texFuncs,pQVar1->textureId,pQVar1->target,pQVar1->bindingTarget);
  if (!resetBaseLevel) {
    return;
  }
  setMipBaseLevel(this,baseLevel_00);
  return;
}

Assistant:

void QOpenGLTexture::generateMipMaps(int baseLevel, bool resetBaseLevel)
{
    Q_D(QOpenGLTexture);
    Q_ASSERT(d->texFuncs);
    Q_ASSERT(d->textureId);
    if (isCompressedFormat(d->format)) {
        if (QOpenGLContext *ctx = QOpenGLContext::currentContext())
            if (ctx->isOpenGLES())
                return;
    }
    int oldBaseLevel;
    if (resetBaseLevel)
        oldBaseLevel = mipBaseLevel();
    setMipBaseLevel(baseLevel);
    d->texFuncs->glGenerateTextureMipmap(d->textureId, d->target, d->bindingTarget);
    if (resetBaseLevel)
        setMipBaseLevel(oldBaseLevel);
}